

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_structs.c
# Opt level: O0

exr_result_t dispatch_print_error(exr_const_context_t_conflict ctxt,exr_result_t code,char *msg,...)

{
  char *in_RDX;
  exr_result_t in_ESI;
  long in_RDI;
  va_list stkargs;
  va_list fmtargs;
  int nwrit;
  char *heapbuf;
  char stackbuf [256];
  char *in_stack_fffffffffffffde8;
  exr_result_t in_stack_fffffffffffffdf4;
  exr_const_context_t_conflict in_stack_fffffffffffffdf8;
  undefined8 local_168;
  undefined1 *puStack_160;
  undefined1 *local_158;
  undefined4 local_148;
  undefined4 uStack_144;
  undefined1 *puStack_140;
  undefined1 *local_138;
  int local_124;
  char *local_120;
  char local_118 [256];
  char *local_18;
  exr_result_t local_c;
  long local_8;
  
  local_158 = &stack0xfffffffffffffde8;
  local_138 = &stack0xfffffffffffffde8;
  local_120 = (char *)0x0;
  local_124 = 0;
  puStack_160 = &stack0x00000008;
  uStack_144 = 0x30;
  local_148 = 0x18;
  local_168 = 0x3000000018;
  puStack_140 = puStack_160;
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  local_124 = vsnprintf(local_118,0x100,in_RDX,&local_168);
  if (local_124 < 0x100) {
    dispatch_error(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8);
  }
  else {
    local_120 = (char *)(**(code **)(local_8 + 0x58))((long)(local_124 + 1));
    if (local_120 == (char *)0x0) {
      dispatch_error(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8);
    }
    else {
      vsnprintf(local_120,(long)(local_124 + 1),local_18,&local_148);
      dispatch_error(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4,in_stack_fffffffffffffde8);
      (**(code **)(local_8 + 0x60))(local_120);
    }
  }
  return local_c;
}

Assistant:

static exr_result_t
dispatch_print_error (
    exr_const_context_t ctxt, exr_result_t code, const char* msg, ...)
{
    char    stackbuf[256];
    char*   heapbuf = NULL;
    int     nwrit   = 0;
    va_list fmtargs;

    va_start (fmtargs, msg);
    {
        va_list stkargs;

        va_copy (stkargs, fmtargs);
        nwrit = vsnprintf (stackbuf, 256, msg, stkargs);
        va_end (stkargs);
        if (nwrit >= 256)
        {
            heapbuf = ctxt->alloc_fn ((size_t) (nwrit + 1));
            if (heapbuf)
            {
                (void) vsnprintf (heapbuf, (size_t) (nwrit + 1), msg, fmtargs);
                dispatch_error (ctxt, code, heapbuf);
                ctxt->free_fn (heapbuf);
            }
            else
                dispatch_error (
                    ctxt, code, "Unable to allocate temporary memory");
        }
        else
            dispatch_error (ctxt, code, stackbuf);
    }
    va_end (fmtargs);
    return code;
}